

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testURI.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char **ppcVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uStack_430;
  char str [1024];
  
  uVar6 = 1;
  if ((1 < argc) && (argv[1] != (char *)0x0)) {
    uStack_430 = 0x10125c;
    iVar1 = strcmp(argv[1],"--relative");
    if (iVar1 == 0) {
      relative = relative + 1;
      uVar6 = 2;
    }
  }
  uVar7 = uVar6;
  if (((int)uVar6 < argc) && (pcVar2 = argv[uVar6], pcVar2 != (char *)0x0)) {
    uStack_430 = 0x10128a;
    iVar1 = strcmp(pcVar2,"-base");
    if (iVar1 != 0) {
      uStack_430 = 0x10129d;
      iVar1 = strcmp(pcVar2,"--base");
      if (iVar1 != 0) goto LAB_001012bb;
    }
    base = argv[uVar6 + 1];
    uVar7 = uVar6 + 2;
    if (base == (char *)0x0) {
      uVar7 = uVar6 + 1;
    }
  }
LAB_001012bb:
  if (((int)uVar7 < argc) && (pcVar2 = argv[uVar7], pcVar2 != (char *)0x0)) {
    uStack_430 = 0x1012db;
    iVar1 = strcmp(pcVar2,"-escape");
    if (iVar1 != 0) {
      uStack_430 = 0x1012ee;
      iVar1 = strcmp(pcVar2,"--escape");
      if (iVar1 != 0) goto LAB_001012fb;
    }
    uVar7 = uVar7 + 1;
    escape = escape + 1;
  }
LAB_001012fb:
  if (((int)uVar7 < argc) && (pcVar2 = argv[uVar7], pcVar2 != (char *)0x0)) {
    uStack_430 = 0x10131b;
    iVar1 = strcmp(pcVar2,"-debug");
    if (iVar1 != 0) {
      uStack_430 = 0x10132e;
      iVar1 = strcmp(pcVar2,"--debug");
      if (iVar1 != 0) goto LAB_0010133b;
    }
    uVar7 = uVar7 + 1;
    debug = debug + 1;
  }
LAB_0010133b:
  pcVar2 = argv[uVar7];
  if (pcVar2 == (char *)0x0) {
    while( true ) {
      uStack_430 = 0x101386;
      pcVar2 = fgets(str,0x3ff,_stdin);
      if (pcVar2 == (char *)0x0) break;
      uStack_430 = 0x101393;
      sVar3 = strlen(str);
      uVar4 = sVar3 & 0xffffffff;
      while (((0 < (int)uVar4 && ((ulong)(byte)str[uVar4 - 1] < 0x21)) &&
             ((0x100002600U >> ((ulong)(byte)str[uVar4 - 1] & 0x3f) & 1) != 0))) {
        str[uVar4 - 1] = '\0';
        uVar4 = uVar4 - 1;
      }
      uStack_430 = 0x1013bc;
      handleURI(str);
    }
  }
  else {
    ppcVar5 = argv + uVar7;
    while (ppcVar5 = ppcVar5 + 1, pcVar2 != (char *)0x0) {
      uStack_430 = 0x101359;
      handleURI(pcVar2);
      pcVar2 = *ppcVar5;
    }
  }
  uStack_430 = 0x1013c3;
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i, arg = 1;

    if ((argc > arg) && (argv[arg] != NULL) &&
	(!strcmp(argv[arg], "--relative"))) {
	arg++;
	relative++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-base")) || (!strcmp(argv[arg], "--base")))) {
	arg++;
	base = argv[arg];
	if (base != NULL)
	    arg++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-escape")) || (!strcmp(argv[arg], "--escape")))) {
	arg++;
	escape++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-debug")) || (!strcmp(argv[arg], "--debug")))) {
	arg++;
	debug++;
    }
    if (argv[arg] == NULL) {
	char str[1024];

        while (1) {
	    /*
	     * read one line in string buffer.
	     */
	    if (fgets (&str[0], sizeof (str) - 1, stdin) == NULL)
	       break;

	    /*
	     * remove the ending spaces
	     */
	    i = strlen(str);
	    while ((i > 0) &&
		   ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		    (str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
		i--;
		str[i] = 0;
	    }
	    handleURI(str);
        }
    } else {
	while (argv[arg] != NULL) {
	    handleURI(argv[arg]);
	    arg++;
	}
    }
    xmlMemoryDump();
    return(0);
}